

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

token_t __thiscall grammar::add_nonterminal(grammar *this,symbol_t *symbol,token_t nonterm)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *lhs;
  _Base_ptr p_Var3;
  key_type local_24;
  
  local_24.internal_rep = nonterm.internal_rep;
  sVar2 = std::
          map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
          ::count(&this->symbols,&local_24);
  if (sVar2 == 0) {
    std::
    _Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>>
    ::
    _M_emplace_unique<strong_t<int,grammar::token_tag>&,strong_t<std::__cxx11::string,grammar::symbol_tag>const&>
              ((_Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>>
                *)this,&local_24,symbol);
  }
  else {
    lhs = std::
          map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
          ::at(&this->symbols,&local_24);
    bVar1 = operator==(lhs,symbol);
    if (!bVar1) {
      for (p_Var3 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        bVar1 = operator==((this_t *)&p_Var3[1]._M_parent,symbol);
        if (bVar1) {
          return (token_t)p_Var3[1]._M_color;
        }
      }
      local_24.internal_rep = (int)get_nonterminal(this,symbol);
    }
  }
  return (token_t)local_24.internal_rep;
}

Assistant:

token_t grammar::add_nonterminal(const symbol_t & symbol, token_t nonterm) {
    if (symbols.count(nonterm) == 0) {
        symbols.emplace(nonterm, symbol);
        return nonterm;
    } else if (symbols.at(nonterm) == symbol)
        return nonterm;

    for (auto & entry : symbols)
        if (entry.second == symbol) return entry.first;

    return this->get_nonterminal(symbol);
}